

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_bias_test.cc
# Opt level: O2

void intgemm::kernel_add_bias_test<(intgemm::CPUType)1,short>(void)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  short local_102 [5];
  AlignedVector<short> output;
  AlignedVector<short> bias;
  AlignedVector<short> input;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_short_&,_const_short_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (0 < kCPU) {
    AlignedVector<short>::AlignedVector(&input,8,0x40);
    AlignedVector<short>::AlignedVector(&bias,8,0x40);
    AlignedVector<short>::AlignedVector(&output,8,0x40);
    lVar16 = 0;
    for (lVar15 = input.size_ * 2; lVar15 != 0; lVar15 = lVar15 + -2) {
      input.mem_[lVar16] = (short)lVar16;
      lVar16 = lVar16 + 1;
    }
    for (lVar15 = 0; bias.size_ * 2 != lVar15; lVar15 = lVar15 + 2) {
      *(undefined2 *)((long)bias.mem_ + lVar15) = 100;
    }
    sVar1 = bias.mem_[1];
    sVar2 = bias.mem_[2];
    sVar3 = bias.mem_[3];
    sVar4 = bias.mem_[4];
    sVar5 = bias.mem_[5];
    sVar6 = bias.mem_[6];
    sVar7 = bias.mem_[7];
    sVar8 = input.mem_[1];
    sVar9 = input.mem_[2];
    sVar10 = input.mem_[3];
    sVar11 = input.mem_[4];
    sVar12 = input.mem_[5];
    sVar13 = input.mem_[6];
    sVar14 = input.mem_[7];
    *output.mem_ = *bias.mem_ + *input.mem_;
    output.mem_[1] = sVar1 + sVar8;
    output.mem_[2] = sVar2 + sVar9;
    output.mem_[3] = sVar3 + sVar10;
    output.mem_[4] = sVar4 + sVar11;
    output.mem_[5] = sVar5 + sVar12;
    output.mem_[6] = sVar6 + sVar13;
    output.mem_[7] = sVar7 + sVar14;
    lVar15 = 0;
    for (uVar17 = 0; uVar17 < output.size_; uVar17 = uVar17 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/add_bias_test.cc"
      ;
      local_c8.line = 0x1d;
      Catch::StringRef::StringRef(&local_b8,"output[i] == ElemType_(100 + i)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = (char *)((long)output.mem_ + lVar15);
      local_102[0] = (short)uVar17 + 100;
      Catch::ExprLhs<short_const&>::operator==
                (&local_a8,(ExprLhs<short_const&> *)&local_c8,local_102);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      lVar15 = lVar15 + 2;
    }
    free(output.mem_);
    free(bias.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_add_bias_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static auto VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> bias(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));
  std::fill(bias.begin(), bias.end(), static_cast<ElemType_>(100));

  *output.template as<vec_t>() = kernels::add_bias(*input.template as<vec_t>(), bias.begin(), 0);
  for (std::size_t i = 0; i < output.size(); ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == static_cast<ElemType_>(bias[i] + input[i])); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(100 + i));
#endif
}